

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O3

void __thiscall
amrex::FluxRegister::FineAdd
          (FluxRegister *this,FArrayBox *flux,int dir,int boxno,int srccomp,int destcomp,int numcomp
          ,Real mult,RunOn runon)

{
  int *piVar1;
  Box *pBVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Dim3 local_100;
  Array4<double> local_f0;
  Array4<const_double> local_b0;
  Array4<double> local_70;
  
  iVar5 = FabArrayBase::localindex((FabArrayBase *)((this->super_BndryRegister).bndry + dir),boxno);
  lVar3 = *(long *)((long)(this->super_BndryRegister).bndry[dir].m_mf.
                          super_FabArray<amrex::FArrayBox>.m_fabs_v.
                          super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)iVar5 * 8);
  iVar5 = FabArrayBase::localindex
                    ((FabArrayBase *)((this->super_BndryRegister).bndry + (dir + 3)),boxno);
  lVar4 = *(long *)((long)(this->super_BndryRegister).bndry[dir + 3].m_mf.
                          super_FabArray<amrex::FArrayBox>.m_fabs_v.
                          super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)iVar5 * 8);
  local_70.p = *(double **)(lVar3 + 0x10);
  local_70.ncomp = *(int *)(lVar3 + 0x34);
  piVar1 = (int *)(lVar3 + 0x18);
  local_70.begin.z = *(int *)(lVar3 + 0x20);
  local_70.begin.x = piVar1[0];
  local_70.begin.y = piVar1[1];
  lVar7 = (long)*(int *)(lVar3 + 0x28) + 1;
  lVar6 = (long)*(int *)(lVar3 + 0x2c) + 1;
  local_70.jstride = ((long)*(int *)(lVar3 + 0x24) - (long)*piVar1) + 1;
  local_70.kstride = (lVar7 - *(int *)(lVar3 + 0x1c)) * local_70.jstride;
  local_70.nstride = (lVar6 - local_70.begin.z) * local_70.kstride;
  local_70.end._0_8_ = (long)*(int *)(lVar3 + 0x24) + 1U & 0xffffffff | lVar7 << 0x20;
  local_70.end.z = (int)lVar6;
  local_f0.p = *(double **)(lVar4 + 0x10);
  local_f0.ncomp = *(int *)(lVar4 + 0x34);
  piVar1 = (int *)(lVar4 + 0x18);
  local_f0.begin.z = *(int *)(lVar4 + 0x20);
  local_f0.begin.x = piVar1[0];
  local_f0.begin.y = piVar1[1];
  lVar6 = (long)*(int *)(lVar4 + 0x28) + 1;
  local_f0.jstride = ((long)*(int *)(lVar4 + 0x24) - (long)*piVar1) + 1;
  lVar7 = (long)*(int *)(lVar4 + 0x2c) + 1;
  local_f0.kstride = (lVar6 - *(int *)(lVar4 + 0x1c)) * local_f0.jstride;
  local_f0.nstride = (lVar7 - local_f0.begin.z) * local_f0.kstride;
  local_f0.end._0_8_ = (long)*(int *)(lVar4 + 0x24) + 1U & 0xffffffff | lVar6 << 0x20;
  local_f0.end.z = (int)lVar7;
  local_b0.p = (flux->super_BaseFab<double>).dptr;
  local_b0.ncomp = (flux->super_BaseFab<double>).nvar;
  pBVar2 = &(flux->super_BaseFab<double>).domain;
  local_b0.begin.z = (flux->super_BaseFab<double>).domain.smallend.vect[2];
  local_b0.begin.x = (pBVar2->smallend).vect[0];
  local_b0.begin.y = (pBVar2->smallend).vect[1];
  lVar7 = (long)(flux->super_BaseFab<double>).domain.bigend.vect[0];
  lVar8 = (long)(flux->super_BaseFab<double>).domain.bigend.vect[1] + 1;
  lVar6 = (long)(flux->super_BaseFab<double>).domain.bigend.vect[2] + 1;
  local_b0.jstride = (lVar7 - (pBVar2->smallend).vect[0]) + 1;
  local_b0.kstride =
       (lVar8 - (flux->super_BaseFab<double>).domain.smallend.vect[1]) * local_b0.jstride;
  local_b0.nstride = (lVar6 - local_b0.begin.z) * local_b0.kstride;
  local_b0.end._0_8_ = lVar7 + 1U & 0xffffffff | lVar8 << 0x20;
  local_b0.end.z = (int)lVar6;
  local_100.x = (this->ratio).vect[0];
  local_100.y = (this->ratio).vect[1];
  local_100.z = (this->ratio).vect[2];
  fluxreg_fineadd((Box *)(lVar3 + 0x18),&local_70,destcomp,&local_b0,srccomp,numcomp,dir,&local_100,
                  mult);
  fluxreg_fineadd((Box *)(lVar4 + 0x18),&local_f0,destcomp,&local_b0,srccomp,numcomp,dir,&local_100,
                  mult);
  return;
}

Assistant:

void
FluxRegister::FineAdd (const FArrayBox& flux,
                       int              dir,
                       int              boxno,
                       int              srccomp,
                       int              destcomp,
                       int              numcomp,
                       Real             mult,
                       RunOn            runon) noexcept
{
    BL_ASSERT(srccomp >= 0 && srccomp+numcomp <= flux.nComp());
    BL_ASSERT(destcomp >= 0 && destcomp+numcomp <= ncomp);

    FArrayBox& loreg = bndry[Orientation(dir,Orientation::low)][boxno];
    FArrayBox& hireg = bndry[Orientation(dir,Orientation::high)][boxno];
    const Box& lobox = loreg.box();
    const Box& hibox = hireg.box();

    Array4<Real> loarr = loreg.array();
    Array4<Real> hiarr = hireg.array();
    Array4<Real const> farr = flux.const_array();
    const Dim3 local_ratio = ratio.dim3();

    if ((runon == RunOn::Gpu) && Gpu::inLaunchRegion())
    {
        AMREX_LAUNCH_DEVICE_LAMBDA
        ( lobox, tlobx,
          {
              fluxreg_fineadd(tlobx, loarr, destcomp, farr, srccomp,
                              numcomp, dir, local_ratio, mult);
          },
          hibox, thibx,
          {
              fluxreg_fineadd(thibx, hiarr, destcomp, farr, srccomp,
                              numcomp, dir, local_ratio, mult);
          }
        );
    }
    else
    {
        fluxreg_fineadd(lobox, loarr, destcomp, farr, srccomp,
                        numcomp, dir, local_ratio, mult);
        fluxreg_fineadd(hibox, hiarr, destcomp, farr, srccomp,
                        numcomp, dir, local_ratio, mult);
    }
}